

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::RoundEvenCase::getInputValues
          (RoundEvenCase *this,int numValues,void **values)

{
  float fVar1;
  pointer pSVar2;
  void *pvVar3;
  deUint32 dVar4;
  int iVar5;
  Float<unsigned_int,_8,_23,_127,_3U> FVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec2 ranges [3];
  Random rnd;
  Float<unsigned_short,_5,_10,_15,_3U> local_72;
  int local_70;
  float local_6c;
  float local_68;
  Float<unsigned_int,_8,_23,_127,_3U> local_64;
  ulong local_60;
  float local_58 [6];
  deRandom local_40;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -1000.0;
  local_58[3] = 1000.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar4 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar4 ^ 0xac23f);
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)(pSVar2->varType).m_data.basic.precision;
  iVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (uVar9 == 0) {
    iVar7 = 0;
  }
  else {
    fVar11 = local_58[uVar9 * 2];
    fVar1 = local_58[uVar9 * 2 + 1];
    pvVar3 = *values;
    iVar7 = 0;
    do {
      fVar12 = (float)iVar7 + -10.5;
      if (iVar5 != 0) {
        fVar13 = fVar1;
        if (fVar12 <= fVar1) {
          fVar13 = fVar12;
        }
        uVar10 = -(uint)(fVar12 < fVar11);
        lVar8 = 0;
        do {
          *(uint *)((long)pvVar3 + lVar8) = uVar10 & (uint)fVar11 | ~uVar10 & (uint)fVar13;
          lVar8 = lVar8 + 4;
        } while ((long)iVar5 * 4 != lVar8);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0x14);
    iVar7 = 0x14;
  }
  uVar10 = (numValues - iVar7) * iVar5;
  local_70 = numValues;
  local_60 = uVar9;
  if (0 < (int)uVar10) {
    local_68 = local_58[uVar9 * 2];
    pvVar3 = *values;
    local_6c = local_58[uVar9 * 2 + 1] - local_68;
    uVar9 = 0;
    do {
      fVar11 = deRandom_getFloat(&local_40);
      *(float *)((long)pvVar3 + uVar9 * 4 + (long)(iVar7 * iVar5) * 4) =
           fVar11 * local_6c + local_68;
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  if (((int)local_60 == 1) && (uVar10 = iVar5 * local_70, 0 < (int)uVar10)) {
    uVar9 = 0;
    do {
      local_64.m_value = *(StorageType *)((long)*values + uVar9 * 4);
      local_72.m_value = 0;
      local_72 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>(&local_64)
      ;
      FVar6 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_72);
      *(StorageType *)((long)*values + uVar9 * 4) = FVar6.m_value;
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd				(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		int						numSpecialCases	= 0;

		// Special cases.
		if (precision != glu::PRECISION_LOWP)
		{
			DE_ASSERT(numValues >= 20);
			for (int ndx = 0; ndx < 20; ndx++)
			{
				const float v = de::clamp(float(ndx) - 10.5f, ranges[precision].x(), ranges[precision].y());
				std::fill((float*)values[0], (float*)values[0] + scalarSize, v);
				numSpecialCases += 1;
			}
		}

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + numSpecialCases*scalarSize, (numValues-numSpecialCases)*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}